

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChunkV.cpp
# Opt level: O3

BufferPos * __thiscall
adios2::format::ChunkV::Allocate
          (BufferPos *__return_storage_ptr__,ChunkV *this,size_t size,size_t align)

{
  size_t *psVar1;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *this_00;
  pointer *ppVVar2;
  pointer pVVar3;
  iterator __position;
  iterator __position_00;
  size_t sVar4;
  size_t sVar5;
  pointer pCVar6;
  pointer pVVar7;
  ulong size_00;
  size_t __n;
  Chunk *v;
  VecEntry entry;
  Chunk c;
  VecEntry local_68;
  Chunk local_48;
  
  if (size == 0) {
    sVar5 = (this->super_BufferV).CurOffset;
    __return_storage_ptr__->bufferIdx = -1;
    __return_storage_ptr__->posInBuffer = 0;
    __return_storage_ptr__->globalPos = sVar5;
    return __return_storage_ptr__;
  }
  BufferV::AlignBuffer(&this->super_BufferV,align);
  pVVar7 = (this->super_BufferV).DataV.
           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->super_BufferV).DataV.
           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pVVar3 != pVVar7) && (pVVar3[-1].External == false)) {
    sVar5 = this->m_TailChunkPos;
    if (this->m_TailChunk->Ptr + (sVar5 - pVVar3[-1].Size) == (char *)pVVar3[-1].Base) {
      if (sVar5 + size <= this->m_ChunkSize) {
        pVVar3[-1].Size = pVVar3[-1].Size + size;
        this->m_TailChunkPos = sVar5 + size;
        goto LAB_004a884d;
      }
      v = (this->m_Chunks).
          super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1;
      sVar5 = ChunkAlloc(this,v,sVar5);
      __n = sVar5 - this->m_TailChunkPos;
      if (__n != 0) {
        memset(v->Ptr + this->m_TailChunkPos,0,__n);
        psVar1 = &(this->super_BufferV).CurOffset;
        *psVar1 = *psVar1 + __n;
      }
      pVVar3 = (this->super_BufferV).DataV.
               super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pVVar3[-1].Size = sVar5;
      pVVar3[-1].Base = v->Ptr;
      this->m_TailChunkPos = 0;
      this->m_TailChunk = (Chunk *)0x0;
    }
  }
  size_00 = this->m_ChunkSize;
  if (this->m_ChunkSize <= size) {
    size_00 = size;
  }
  local_48.Ptr = (char *)0x0;
  local_48.AllocatedPtr = (void *)0x0;
  local_48.Size = 0;
  ChunkAlloc(this,&local_48,size_00);
  __position._M_current =
       (this->m_Chunks).
       super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_Chunks).
      super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<adios2::format::ChunkV::Chunk,std::allocator<adios2::format::ChunkV::Chunk>>::
    _M_realloc_insert<adios2::format::ChunkV::Chunk_const&>
              ((vector<adios2::format::ChunkV::Chunk,std::allocator<adios2::format::ChunkV::Chunk>>
                *)&this->m_Chunks,__position,&local_48);
    pCVar6 = (this->m_Chunks).
             super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->Size = local_48.Size;
    (__position._M_current)->Ptr = local_48.Ptr;
    (__position._M_current)->AllocatedPtr = local_48.AllocatedPtr;
    pCVar6 = (this->m_Chunks).
             super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_Chunks).
    super__Vector_base<adios2::format::ChunkV::Chunk,_std::allocator<adios2::format::ChunkV::Chunk>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar6;
  }
  this_00 = &(this->super_BufferV).DataV;
  this->m_TailChunk = pCVar6 + -1;
  this->m_TailChunkPos = size;
  local_68.External = false;
  local_68.Base = pCVar6[-1].Ptr;
  local_68.Offset = 0;
  __position_00._M_current =
       (this->super_BufferV).DataV.
       super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->super_BufferV).DataV.
      super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68.Size = size;
    std::vector<adios2::format::BufferV::VecEntry,std::allocator<adios2::format::BufferV::VecEntry>>
    ::_M_realloc_insert<adios2::format::BufferV::VecEntry_const&>
              ((vector<adios2::format::BufferV::VecEntry,std::allocator<adios2::format::BufferV::VecEntry>>
                *)this_00,__position_00,&local_68);
  }
  else {
    (__position_00._M_current)->Offset = 0;
    (__position_00._M_current)->Size = size;
    *(ulong *)__position_00._M_current = (ulong)(uint7)local_68._1_7_ << 8;
    (__position_00._M_current)->Base = local_68.Base;
    ppVVar2 = &(this->super_BufferV).DataV.
               super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar2 = *ppVVar2 + 1;
  }
  pVVar7 = (this_00->
           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar5 = 0;
LAB_004a884d:
  sVar4 = (this->super_BufferV).CurOffset;
  __return_storage_ptr__->bufferIdx =
       (int)((ulong)((long)(this->super_BufferV).DataV.
                           super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7) >> 5) + -1;
  __return_storage_ptr__->posInBuffer = sVar5;
  __return_storage_ptr__->globalPos = sVar4;
  (this->super_BufferV).CurOffset = size + sVar4;
  return __return_storage_ptr__;
}

Assistant:

BufferV::BufferPos ChunkV::Allocate(const size_t size, size_t align)
{
    /*std::cout << "  Allocate: size = " << size << " align = " << align
              << std::endl;*/
    if (size == 0)
    {
        return BufferPos(-1, 0, CurOffset);
    }

    AlignBuffer(align);

    // we can possibly append this entry to the last if the last was
    // internal
    bool AppendPossible =
        DataV.size() && !DataV.back().External &&
        (m_TailChunk->Ptr + m_TailChunkPos - DataV.back().Size == DataV.back().Base);

    if (AppendPossible && (m_TailChunkPos + size > m_ChunkSize))
    {
        // No room in current chunk, close it out
        // realloc down to used size (helpful?) and set size in array
        Chunk &c = m_Chunks.back();
        size_t actualsize = ChunkAlloc(c, m_TailChunkPos);
        size_t alignment = actualsize - m_TailChunkPos;
        if (alignment)
        {
            auto p = c.Ptr + m_TailChunkPos;
            std::fill(p, p + alignment, 0);
            CurOffset += alignment;
        }
        // Update entry in DataV as size and potentiall ptr has changed
        // Learned from sanitizer: downsizing realloc still may change pointer
        VecEntry &dv = DataV.back();
        dv.Size = actualsize;
        dv.Base = c.Ptr;
        m_TailChunkPos = 0;
        m_TailChunk = nullptr;
        AppendPossible = false;
    }

    size_t bufferPos = 0;
    if (AppendPossible)
    {
        // We can use current chunk, just append the data;
        bufferPos = m_TailChunkPos;
        DataV.back().Size += size;
        m_TailChunkPos += size;
    }
    else
    {
        // We need a new chunk, get the larger of size or m_ChunkSize
        size_t NewSize = m_ChunkSize;
        if (size > m_ChunkSize)
            NewSize = size;
        Chunk c{nullptr, nullptr, 0};
        ChunkAlloc(c, NewSize);
        m_Chunks.push_back(c);
        m_TailChunk = &m_Chunks.back();
        bufferPos = 0;
        m_TailChunkPos = size;
        VecEntry entry = {false, m_TailChunk->Ptr, 0, size};
        DataV.push_back(entry);
    }

    BufferPos bp(static_cast<int>(DataV.size() - 1), bufferPos, CurOffset);
    // valid ptr anytime <-- DataV[idx] + bufferPos;

    CurOffset += size;

    return bp;
}